

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqResWithDeletion.cpp
# Opt level: O3

void __thiscall Shell::EqResWithDeletionExtra::output(EqResWithDeletionExtra *this,ostream *out)

{
  Literal *this_00;
  bool bVar1;
  ostream *poVar2;
  _Hash_node_base *p_Var3;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"resolved=[",10);
  p_Var3 = (this->resolved)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    bVar1 = true;
    do {
      this_00 = (Literal *)p_Var3[1]._M_nxt;
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
      Kernel::Literal::toString_abi_cxx11_(&local_50,this_00);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = p_Var3->_M_nxt;
      bVar1 = false;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  return;
}

Assistant:

void EqResWithDeletionExtra::output(std::ostream &out) const {
  bool first = true;
  out << "resolved=[";
  for(Literal *l : resolved) {
    if(!first)
      out << ",";
    first = false;
    out << "(" << l->toString() << ")";
  }
  out << "]";

}